

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::FinishTestProcess
          (cmCTestMultiProcessHandler *this,
          unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner,bool started)

{
  bool bVar1;
  pointer pcVar2;
  reference ppVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference puVar6;
  bool local_b1;
  unsigned_long local_90;
  unsigned_long p;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *t;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_38;
  byte local_29;
  cmCTestTestProperties *pcStack_28;
  bool testResult;
  cmCTestTestProperties *properties;
  int test;
  bool started_local;
  unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *runner_local;
  cmCTestMultiProcessHandler *this_local;
  
  this->Completed = this->Completed + 1;
  properties._7_1_ = started;
  _test = runner;
  runner_local = (unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)this;
  pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->(runner)
  ;
  properties._0_4_ = cmCTestRunTest::GetIndex(pcVar2);
  pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->(runner)
  ;
  pcStack_28 = cmCTestRunTest::GetTestProperties(pcVar2);
  pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->(runner)
  ;
  local_29 = cmCTestRunTest::EndTest
                       (pcVar2,this->Completed,this->Total,(bool)(properties._7_1_ & 1));
  pcVar2 = std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::operator->(runner)
  ;
  bVar1 = cmCTestRunTest::TimedOutForStopTime(pcVar2);
  if (bVar1) {
    SetStopTimePassed(this);
  }
  if ((properties._7_1_ & 1) != 0) {
    local_b1 = false;
    if ((this->StopTimePassed & 1U) == 0) {
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::unique_ptr
                (&local_38,runner);
      local_b1 = cmCTestRunTest::StartAgain(&local_38,this->Completed);
      std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&local_38);
    }
    if (local_b1 != false) {
      this->Completed = this->Completed - 1;
      return;
    }
  }
  if ((local_29 & 1) == 0) {
    if ((pcStack_28->Disabled & 1U) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->Failed,&pcStack_28->Name);
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this->Passed,&pcStack_28->Name);
  }
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  t = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
      std::
      map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::end(&(this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           );
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t), bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator*(&__end1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&(ppVar3->second).super_set<int,_std::less<int>,_std::allocator<int>_>,
               (key_type_conflict *)&properties);
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestFinishMap,(key_type_conflict *)&properties);
  *pmVar4 = true;
  pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,(key_type_conflict *)&properties);
  *pmVar4 = false;
  WriteCheckpoint(this,(int)properties);
  DeallocateResources(this,(int)properties);
  UnlockResources(this,(int)properties);
  sVar5 = GetProcessorsUsed(this,(int)properties);
  this->RunningCount = this->RunningCount - sVar5;
  this_00 = &pcStack_28->Affinity;
  __end1_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
  p = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&p), bVar1) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1_1);
    local_90 = *puVar6;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              (&this->ProcessorsAvailable,&local_90);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&pcStack_28->Affinity);
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::reset(runner,(pointer)0x0);
  if ((properties._7_1_ & 1) != 0) {
    StartNextTests(this);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::FinishTestProcess(
  std::unique_ptr<cmCTestRunTest> runner, bool started)
{
  this->Completed++;

  int test = runner->GetIndex();
  auto* properties = runner->GetTestProperties();

  bool testResult = runner->EndTest(this->Completed, this->Total, started);
  if (runner->TimedOutForStopTime()) {
    this->SetStopTimePassed();
  }
  if (started) {
    if (!this->StopTimePassed &&
        cmCTestRunTest::StartAgain(std::move(runner), this->Completed)) {
      this->Completed--; // remove the completed test because run again
      return;
    }
  }

  if (testResult) {
    this->Passed->push_back(properties->Name);
  } else if (!properties->Disabled) {
    this->Failed->push_back(properties->Name);
  }

  for (auto& t : this->Tests) {
    t.second.erase(test);
  }

  this->TestFinishMap[test] = true;
  this->TestRunningMap[test] = false;
  this->WriteCheckpoint(test);
  this->DeallocateResources(test);
  this->UnlockResources(test);
  this->RunningCount -= this->GetProcessorsUsed(test);

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  runner.reset();
  if (started) {
    this->StartNextTests();
  }
}